

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::anon_unknown_20::CheckParseInputSize
               (StringPiece input,ErrorCollector *error_collector)

{
  char *i64;
  char *f;
  AlphaNum local_140;
  AlphaNum local_110;
  char *local_e0;
  undefined8 local_d8;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  i64 = input.ptr_;
  if (0x7fffffff < (long)i64) {
    local_e0 = "Input size too large: ";
    local_d8 = 0x16;
    strings::AlphaNum::AlphaNum(&local_b0,(long)i64);
    f = " bytes";
    local_140.piece_data_ = " > ";
    local_140.piece_size_ = 3;
    strings::AlphaNum::AlphaNum(&local_80,0x7fffffff);
    local_110.piece_data_ = " bytes.";
    local_110.piece_size_ = 7;
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_e0,&local_b0,(AlphaNum *)&stack0xfffffffffffffe90
                      ,&local_140,&local_80,&local_110,(AlphaNum *)f);
    (**(code **)(*(long *)input.length_ + 0x10))
              ((long *)input.length_,0xffffffffffffffff,0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (long)i64 < 0x80000000;
}

Assistant:

bool CheckParseInputSize(StringPiece input,
                         io::ErrorCollector* error_collector) {
  if (input.size() > INT_MAX) {
    error_collector->AddError(
        -1, 0,
        StrCat("Input size too large: ", static_cast<int64>(input.size()),
                     " bytes", " > ", INT_MAX, " bytes."));
    return false;
  }
  return true;
}